

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

int arg_parse(int argc,char **argv,void **argtable)

{
  char *pcVar1;
  arg_end *endtable;
  code *pcVar2;
  void *pvVar3;
  long lVar4;
  char **nargv;
  ulong uVar5;
  long lVar6;
  size_t sVar7;
  char *pcVar8;
  int *__ptr;
  byte *pbVar9;
  void **ppvVar10;
  ulong uVar11;
  int *piVar12;
  char *pcVar13;
  char *pcVar14;
  byte bVar15;
  char cVar16;
  long lVar17;
  size_t size;
  void *pvVar18;
  int iVar19;
  arg_hdr **table;
  long lVar20;
  
  ppvVar10 = argtable;
  do {
    pbVar9 = (byte *)*ppvVar10;
    if (*(code **)(pbVar9 + 0x38) != (code *)0x0) {
      (**(code **)(pbVar9 + 0x38))(*(undefined8 *)(pbVar9 + 0x30));
      pbVar9 = (byte *)*ppvVar10;
    }
    ppvVar10 = ppvVar10 + 1;
  } while ((*pbVar9 & 1) == 0);
  lVar4 = -0x100000000;
  ppvVar10 = argtable;
  do {
    pbVar9 = (byte *)*ppvVar10;
    lVar4 = lVar4 + 0x100000000;
    ppvVar10 = ppvVar10 + 1;
  } while ((*pbVar9 & 1) == 0);
  endtable = *(arg_end **)((long)argtable + (lVar4 >> 0x1d));
  if (argc == 0) {
    arg_parse_check((arg_hdr **)argtable,endtable);
LAB_00131358:
    return endtable->count;
  }
  nargv = (char **)argtable3_xmalloc((long)argc * 8 + 8);
  uVar5 = 0;
  uVar11 = 0;
  if (0 < argc) {
    uVar11 = (ulong)(uint)argc;
  }
  for (; uVar11 != uVar5; uVar5 = uVar5 + 1) {
    nargv[uVar5] = argv[uVar5];
  }
  nargv[argc] = (char *)0x0;
  iVar19 = 1;
  lVar20 = 0;
  lVar4 = 0;
  do {
    lVar6 = lVar4;
    pbVar9 = (byte *)argtable[lVar20];
    pcVar8 = *(char **)(pbVar9 + 0x10);
    lVar17 = 1;
    if (pcVar8 != (char *)0x0) {
      sVar7 = strlen(pcVar8);
      lVar17 = sVar7 + 1;
    }
    uVar5 = (long)iVar19 << 5 | 0x10;
    while (pcVar8 != (char *)0x0) {
      iVar19 = iVar19 + 1;
      pcVar8 = strchr(pcVar8 + 1,0x2c);
      uVar5 = uVar5 + 0x20;
    }
    lVar20 = lVar20 + 1;
    lVar4 = lVar6 + lVar17;
  } while ((*pbVar9 & 1) == 0);
  __ptr = (int *)argtable3_xmalloc(lVar17 + lVar6 + uVar5);
  *__ptr = 0;
  __ptr[1] = iVar19;
  piVar12 = __ptr + 4;
  *(int **)(__ptr + 2) = piVar12;
  pcVar8 = (char *)((long)__ptr + uVar5);
  lVar20 = 0;
  lVar4 = 0;
  while( true ) {
    lVar4 = (long)(int)lVar4;
    if ((*argtable[lVar20] & 1) != 0) break;
    for (pcVar13 = *(char **)((long)argtable[lVar20] + 0x10);
        (pcVar13 != (char *)0x0 && (cVar16 = *pcVar13, pcVar14 = pcVar8, cVar16 != '\0'));
        pcVar13 = pcVar13 + (cVar16 == ',')) {
      while ((cVar16 != '\0' && (cVar16 != ','))) {
        *pcVar14 = cVar16;
        pcVar1 = pcVar13 + 1;
        pcVar13 = pcVar13 + 1;
        pcVar14 = pcVar14 + 1;
        cVar16 = *pcVar1;
      }
      *pcVar14 = '\0';
      cVar16 = *pcVar13;
      piVar12 = *(int **)(__ptr + 2);
      *(char **)(piVar12 + lVar4 * 8) = pcVar8;
      *(int **)(piVar12 + lVar4 * 8 + 4) = __ptr;
      piVar12[lVar4 * 8 + 6] = (int)lVar20;
      if ((*argtable[lVar20] & 4) == 0) {
        if ((*argtable[lVar20] & 2) == 0) {
          piVar12[lVar4 * 8 + 2] = 0;
        }
        else {
          piVar12[lVar4 * 8 + 2] = 1;
        }
      }
      else {
        piVar12[lVar4 * 8 + 2] = 2;
      }
      lVar4 = lVar4 + 1;
      pcVar8 = pcVar14 + 1;
    }
    lVar20 = lVar20 + 1;
  }
  (piVar12 + lVar4 * 8)[0] = 0;
  (piVar12 + lVar4 * 8)[1] = 0;
  piVar12[lVar4 * 8 + 2] = 0;
  (piVar12 + lVar4 * 8 + 4)[0] = 0;
  (piVar12 + lVar4 * 8 + 4)[1] = 0;
  piVar12[lVar4 * 8 + 6] = 0;
  size = 2;
  for (ppvVar10 = argtable; (**ppvVar10 & 1) == 0; ppvVar10 = ppvVar10 + 1) {
    pcVar8 = *(char **)((long)*ppvVar10 + 8);
    if (pcVar8 == (char *)0x0) {
      lVar4 = 0;
    }
    else {
      sVar7 = strlen(pcVar8);
      lVar4 = sVar7 * 3;
    }
    size = size + lVar4;
  }
  pcVar8 = (char *)argtable3_xmalloc(size);
  *pcVar8 = ':';
  pcVar13 = pcVar8 + 1;
  lVar4 = 0;
  while (pbVar9 = (byte *)argtable[lVar4], (*pbVar9 & 1) == 0) {
    pcVar14 = *(char **)(pbVar9 + 8);
    while ((pcVar14 != (char *)0x0 && (*pcVar14 != '\0'))) {
      *pcVar13 = *pcVar14;
      bVar15 = *pbVar9;
      if ((bVar15 & 2) == 0) {
        pcVar13 = pcVar13 + 1;
      }
      else {
        pcVar13[1] = ':';
        pcVar13 = pcVar13 + 2;
        bVar15 = *pbVar9;
      }
      pcVar14 = pcVar14 + 1;
      if ((bVar15 & 4) != 0) {
        *pcVar13 = ':';
        pcVar13 = pcVar13 + 1;
      }
    }
    lVar4 = lVar4 + 1;
  }
  *pcVar13 = '\0';
  optind = 0;
  opterr = 0;
LAB_00131065:
  iVar19 = getopt_long(argc,nargv,pcVar8,*(option **)(__ptr + 2),(int *)0x0);
  if (iVar19 == 0) {
    iVar19 = *__ptr;
    pbVar9 = (byte *)argtable[iVar19];
    pvVar18 = *(void **)(pbVar9 + 0x30);
    if (((optarg != (char *)0x0) && (*optarg == '\0')) && ((*pbVar9 & 2) != 0)) {
      arg_register_error(endtable,endtable,5,nargv[(long)optind + -1]);
      pbVar9 = (byte *)argtable[iVar19];
    }
    if (*(code **)(pbVar9 + 0x40) != (code *)0x0) {
      iVar19 = (**(code **)(pbVar9 + 0x40))(pvVar18,optarg);
joined_r0x00131172:
      if (iVar19 != 0) {
        arg_register_error(endtable,pvVar18,iVar19,optarg);
      }
    }
    goto LAB_00131065;
  }
  if (iVar19 == 0x3a) {
    arg_register_error(endtable,endtable,5,nargv[(long)optind + -1]);
    goto LAB_00131065;
  }
  if (iVar19 == 0x3f) {
    if (optopt == 0) {
      arg_register_error(endtable,endtable,4,nargv[(long)optind + -1]);
    }
    else {
      arg_register_error(endtable,endtable,optopt,(char *)0x0);
    }
    goto LAB_00131065;
  }
  if (iVar19 != -1) {
    lVar4 = 0;
    for (ppvVar10 = argtable; (**ppvVar10 & 1) == 0; ppvVar10 = ppvVar10 + 1) {
      pcVar13 = *(char **)((long)*ppvVar10 + 8);
      if ((pcVar13 != (char *)0x0) &&
         (pcVar13 = strchr(pcVar13,(int)(char)iVar19), pcVar13 != (char *)0x0)) {
        lVar4 = *(long *)((long)argtable + (lVar4 >> 0x1d));
        pcVar2 = *(code **)(lVar4 + 0x40);
        if (pcVar2 == (code *)0x0) goto LAB_00131065;
        pvVar18 = *(void **)(lVar4 + 0x30);
        iVar19 = (*pcVar2)(pvVar18,optarg);
        goto joined_r0x00131172;
      }
      lVar4 = lVar4 + 0x100000000;
    }
    arg_register_error(endtable,endtable,iVar19,(char *)0x0);
    goto LAB_00131065;
  }
  free(pcVar8);
  free(__ptr);
  pcVar8 = (char *)0x0;
  iVar19 = 0;
  uVar5 = 0;
  pvVar18 = (void *)0x0;
LAB_0013125f:
  uVar5 = (ulong)(int)uVar5;
  do {
    pbVar9 = (byte *)argtable[uVar5];
    if ((*pbVar9 & 1) != 0) {
      if (iVar19 != 0) {
        arg_register_error(endtable,pvVar18,iVar19,pcVar8);
        optind = optind + 1;
      }
      while (lVar4 = (long)optind, optind < argc) {
        optind = optind + 1;
        arg_register_error(endtable,endtable,3,nargv[lVar4]);
      }
LAB_00131332:
      if (endtable->count == 0) {
        arg_parse_check((arg_hdr **)argtable,endtable);
      }
      free(nargv);
      goto LAB_00131358;
    }
    if (argc <= optind) goto LAB_00131332;
    if (((*(long *)(pbVar9 + 0x10) == 0) && (*(long *)(pbVar9 + 8) == 0)) &&
       (*(code **)(pbVar9 + 0x40) != (code *)0x0)) break;
    uVar5 = uVar5 + 1;
  } while( true );
  pvVar3 = *(void **)(pbVar9 + 0x30);
  iVar19 = (**(code **)(pbVar9 + 0x40))(pvVar3,nargv[optind]);
  if (iVar19 == 0) {
    optind = optind + 1;
    iVar19 = 0;
  }
  else {
    uVar5 = (ulong)((int)uVar5 + 1);
    pcVar8 = nargv[optind];
    pvVar18 = pvVar3;
  }
  goto LAB_0013125f;
}

Assistant:

int arg_parse(int argc, char** argv, void** argtable) {
    struct arg_hdr** table = (struct arg_hdr**)argtable;
    struct arg_end* endtable;
    int endindex;
    char** argvcopy = NULL;
    int i;

    /*printf("arg_parse(%d,%p,%p)\n",argc,argv,argtable);*/

    /* reset any argtable data from previous invocations */
    arg_reset(argtable);

    /* locate the first end-of-table marker within the array */
    endindex = arg_endindex(table);
    endtable = (struct arg_end*)table[endindex];

    /* Special case of argc==0.  This can occur on Texas Instruments DSP. */
    /* Failure to trap this case results in an unwanted NULL result from  */
    /* the malloc for argvcopy (next code block).                         */
    if (argc == 0) {
        /* We must still perform post-parse checks despite the absence of command line arguments */
        arg_parse_check(table, endtable);

        /* Now we are finished */
        return endtable->count;
    }

    argvcopy = (char**)xmalloc(sizeof(char*) * (size_t)(argc + 1));

    /*
        Fill in the local copy of argv[]. We need a local copy
        because getopt rearranges argv[] which adversely affects
        susbsequent parsing attempts.
        */
    for (i = 0; i < argc; i++)
        argvcopy[i] = argv[i];

    argvcopy[argc] = NULL;

    /* parse the command line (local copy) for tagged options */
    arg_parse_tagged(argc, argvcopy, table, endtable);

    /* parse the command line (local copy) for untagged options */
    arg_parse_untagged(argc, argvcopy, table, endtable);

    /* if no errors so far then perform post-parse checks otherwise dont bother */
    if (endtable->count == 0)
        arg_parse_check(table, endtable);

    /* release the local copt of argv[] */
    xfree(argvcopy);

    return endtable->count;
}